

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool wasm::Match::Internal::
     Components<wasm::Binary_*,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
     ::match(matched_t<wasm::Binary_*> candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            *matchers)

{
  matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *pmVar1;
  bool bVar2;
  
  pmVar1 = (matchers->curr).binder;
  if (pmVar1 != (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0) {
    *pmVar1 = candidate->op;
  }
  bVar2 = Components<wasm::Binary_*,_1,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::match(candidate,&matchers->next);
  return bVar2;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }